

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Destroy<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  size_type sVar2;
  string *in_RDI;
  size_t size;
  int i;
  void **elements;
  int n;
  Arena *in_stack_ffffffffffffffc8;
  int local_1c;
  
  if (((in_RDI->field_2)._M_allocated_capacity != 0) && (*(long *)in_RDI == 0)) {
    iVar1 = **(int **)&in_RDI->field_2;
    sVar2 = (in_RDI->field_2)._M_allocated_capacity;
    for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
      cast<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                (*(void **)(sVar2 + 8 + (long)local_1c * 8));
      StringTypeHandler::Delete(in_RDI,in_stack_ffffffffffffffc8);
    }
    operator_delete((void *)(in_RDI->field_2)._M_allocated_capacity,
                    (long)*(int *)((long)&in_RDI->_M_string_length + 4) * 8 + 8);
  }
  (in_RDI->field_2)._M_allocated_capacity = 0;
  return;
}

Assistant:

void RepeatedPtrFieldBase::Destroy() {
  if (rep_ != NULL && arena_ == NULL) {
    int n = rep_->allocated_size;
    void* const* elements = rep_->elements;
    for (int i = 0; i < n; i++) {
      TypeHandler::Delete(cast<TypeHandler>(elements[i]), NULL);
    }
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
    const size_t size = total_size_ * sizeof(elements[0]) + kRepHeaderSize;
    ::operator delete(static_cast<void*>(rep_), size);
#else
    ::operator delete(static_cast<void*>(rep_));
#endif
  }
  rep_ = NULL;
}